

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpring2Constraint::setParam
          (btGeneric6DofSpring2Constraint *this,int num,btScalar value,int axis)

{
  btScalar *pbVar1;
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  btScalar in_XMM0_Da;
  
  if ((in_EDX < 0) || (2 < in_EDX)) {
    if ((2 < in_EDX) && (in_EDX < 6)) {
      switch(in_ESI) {
      case 1:
        *(btScalar *)(in_RDI + (long)(in_EDX + -3) * 0x58 + 0x3f4) = in_XMM0_Da;
        *(uint *)(in_RDI + 0x5c8) = 8 << ((byte)(in_EDX << 2) & 0x1f) | *(uint *)(in_RDI + 0x5c8);
        break;
      case 2:
        *(btScalar *)(in_RDI + (long)(in_EDX + -3) * 0x58 + 0x3ec) = in_XMM0_Da;
        *(uint *)(in_RDI + 0x5c8) = 2 << ((byte)(in_EDX << 2) & 0x1f) | *(uint *)(in_RDI + 0x5c8);
        break;
      case 3:
        *(btScalar *)(in_RDI + (long)(in_EDX + -3) * 0x58 + 0x3f8) = in_XMM0_Da;
        *(uint *)(in_RDI + 0x5c8) = 4 << ((byte)(in_EDX << 2) & 0x1f) | *(uint *)(in_RDI + 0x5c8);
        break;
      case 4:
        *(btScalar *)(in_RDI + (long)(in_EDX + -3) * 0x58 + 0x3f0) = in_XMM0_Da;
        *(uint *)(in_RDI + 0x5c8) = 1 << ((byte)(in_EDX << 2) & 0x1f) | *(uint *)(in_RDI + 0x5c8);
      }
    }
  }
  else {
    switch(in_ESI) {
    case 1:
      pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x310));
      pbVar1[in_EDX] = in_XMM0_Da;
      *(uint *)(in_RDI + 0x5c8) = 8 << ((byte)(in_EDX << 2) & 0x1f) | *(uint *)(in_RDI + 0x5c8);
      break;
    case 2:
      pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2f0));
      pbVar1[in_EDX] = in_XMM0_Da;
      *(uint *)(in_RDI + 0x5c8) = 2 << ((byte)(in_EDX << 2) & 0x1f) | *(uint *)(in_RDI + 0x5c8);
      break;
    case 3:
      pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 800));
      pbVar1[in_EDX] = in_XMM0_Da;
      *(uint *)(in_RDI + 0x5c8) = 4 << ((byte)(in_EDX << 2) & 0x1f) | *(uint *)(in_RDI + 0x5c8);
      break;
    case 4:
      pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x300));
      pbVar1[in_EDX] = in_XMM0_Da;
      *(uint *)(in_RDI + 0x5c8) = 1 << ((byte)(in_EDX << 2) & 0x1f) | *(uint *)(in_RDI + 0x5c8);
    }
  }
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::setParam(int num, btScalar value, int axis)
{
	if((axis >= 0) && (axis < 3))
	{
		switch(num)
		{
			case BT_CONSTRAINT_STOP_ERP : 
				m_linearLimits.m_stopERP[axis] = value;
				m_flags |= BT_6DOF_FLAGS_ERP_STOP2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2);
				break;
			case BT_CONSTRAINT_STOP_CFM : 
				m_linearLimits.m_stopCFM[axis] = value;
				m_flags |= BT_6DOF_FLAGS_CFM_STOP2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2);
				break;
			case BT_CONSTRAINT_ERP : 
				m_linearLimits.m_motorERP[axis] = value;
				m_flags |= BT_6DOF_FLAGS_ERP_MOTO2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2);
				break;
			case BT_CONSTRAINT_CFM : 
				m_linearLimits.m_motorCFM[axis] = value;
				m_flags |= BT_6DOF_FLAGS_CFM_MOTO2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2);
				break;
			default : 
				btAssertConstrParams(0);
		}
	}
	else if((axis >=3) && (axis < 6))
	{
		switch(num)
		{
			case BT_CONSTRAINT_STOP_ERP : 
				m_angularLimits[axis - 3].m_stopERP = value;
				m_flags |= BT_6DOF_FLAGS_ERP_STOP2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2);
				break;
			case BT_CONSTRAINT_STOP_CFM : 
				m_angularLimits[axis - 3].m_stopCFM = value;
				m_flags |= BT_6DOF_FLAGS_CFM_STOP2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2);
				break;
			case BT_CONSTRAINT_ERP : 
				m_angularLimits[axis - 3].m_motorERP = value;
				m_flags |= BT_6DOF_FLAGS_ERP_MOTO2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2);
				break;
			case BT_CONSTRAINT_CFM : 
				m_angularLimits[axis - 3].m_motorCFM = value;
				m_flags |= BT_6DOF_FLAGS_CFM_MOTO2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2);
				break;
			default : 
				btAssertConstrParams(0);
		}
	}
	else
	{
		btAssertConstrParams(0);
	}
}